

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O3

void __thiscall
Variable_addEquivalenceNullptrSecondParameter_Test::TestBody
          (Variable_addEquivalenceNullptrSecondParameter_Test *this)

{
  char cVar1;
  char *pcVar2;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  VariablePtr v1;
  VariablePtr v2;
  long *local_68;
  long *local_60;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  AssertHelper local_50 [8];
  AssertionResult local_48;
  long local_38 [2];
  shared_ptr *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  undefined8 local_18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_10;
  
  libcellml::Variable::create();
  local_18 = 0;
  p_Stack_10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  libcellml::Variable::addEquivalence((shared_ptr *)&local_28,(shared_ptr *)&local_18);
  local_60 = (long *)0x0;
  local_68 = (long *)libcellml::Variable::equivalentVariableCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_48,"size_t(0)","v1->equivalentVariableCount()",
             (unsigned_long *)&local_60,(unsigned_long *)&local_68);
  if (local_48.success_ == false) {
    testing::Message::Message((Message *)&local_60);
    if (local_48.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_48.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/connection/connection.cpp"
               ,0x24,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
    if (local_60 != (long *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && (local_60 != (long *)0x0)) {
        (**(code **)(*local_60 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_48.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cVar1 = libcellml::Variable::hasEquivalentVariable(local_28,SUB81(&local_18,0));
  local_60 = (long *)(CONCAT71(local_60._1_7_,cVar1) ^ 1);
  local_58.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar1 != '\0') {
    testing::Message::Message((Message *)&local_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_48,(char *)&local_60,"v1->hasEquivalentVariable(v2)","true");
    testing::internal::AssertHelper::AssertHelper
              (local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/connection/connection.cpp"
               ,0x25,(char *)CONCAT71(local_48._1_7_,local_48.success_));
    testing::internal::AssertHelper::operator=(local_50,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(local_50);
    if ((long *)CONCAT71(local_48._1_7_,local_48.success_) != local_38) {
      operator_delete((long *)CONCAT71(local_48._1_7_,local_48.success_),local_38[0] + 1);
    }
    if (local_68 != (long *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && (local_68 != (long *)0x0)) {
        (**(code **)(*local_68 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (p_Stack_10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_10);
  }
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  return;
}

Assistant:

TEST(Variable, addEquivalenceNullptrSecondParameter)
{
    libcellml::VariablePtr v1 = libcellml::Variable::create();
    libcellml::VariablePtr v2 = nullptr;
    libcellml::Variable::addEquivalence(v1, v2);
    EXPECT_EQ(size_t(0), v1->equivalentVariableCount());
    EXPECT_FALSE(v1->hasEquivalentVariable(v2));
}